

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O0

npy_api * pybind11::detail::npy_api::lookup(void)

{
  uint uVar1;
  PyObject *pPVar2;
  long lVar3;
  npy_api *in_RDI;
  void **api_ptr;
  undefined1 local_30 [8];
  str_attr_accessor c;
  module m;
  
  module::import((module *)&c.cache,"numpy.core.multiarray");
  object_api<pybind11::handle>::attr
            ((str_attr_accessor *)local_30,(object_api<pybind11::handle> *)&c.cache,"_ARRAY_API");
  pPVar2 = accessor<pybind11::detail::accessor_policies::str_attr>::ptr
                     ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_30);
  lVar3 = PyCapsule_GetPointer(pPVar2,0);
  in_RDI->PyArray_GetNDArrayCFeatureVersion_ = *(_func_uint **)(lVar3 + 0x698);
  uVar1 = (*in_RDI->PyArray_GetNDArrayCFeatureVersion_)();
  if (uVar1 < 7) {
    pybind11_fail("pybind11 numpy support requires numpy >= 1.7.0");
  }
  in_RDI->PyArray_Type_ = *(PyTypeObject **)(lVar3 + 0x10);
  in_RDI->PyVoidArrType_Type_ = *(PyTypeObject **)(lVar3 + 0x138);
  in_RDI->PyArrayDescr_Type_ = *(PyTypeObject **)(lVar3 + 0x18);
  in_RDI->PyArray_DescrFromType_ = *(_func_PyObject_ptr_int **)(lVar3 + 0x168);
  in_RDI->PyArray_DescrFromScalar_ = *(_func_PyObject_ptr_PyObject_ptr **)(lVar3 + 0x1c8);
  in_RDI->PyArray_FromAny_ =
       *(_func_PyObject_ptr_PyObject_ptr_PyObject_ptr_int_int_int_PyObject_ptr **)(lVar3 + 0x228);
  in_RDI->PyArray_Resize_ =
       *(_func_PyObject_ptr_PyObject_ptr_PyArray_Dims_ptr_int_int **)(lVar3 + 0x280);
  in_RDI->PyArray_CopyInto_ = *(_func_int_PyObject_ptr_PyObject_ptr **)(lVar3 + 0x290);
  in_RDI->PyArray_NewCopy_ = *(_func_PyObject_ptr_PyObject_ptr_int **)(lVar3 + 0x2a8);
  in_RDI->PyArray_NewFromDescr_ =
       *(_func_PyObject_ptr_PyTypeObject_ptr_PyObject_ptr_int_Py_intptr_t_ptr_Py_intptr_t_ptr_void_ptr_int_PyObject_ptr
         **)(lVar3 + 0x2f0);
  in_RDI->PyArray_DescrNewFromType_ = *(_func_PyObject_ptr_int **)(lVar3 + 0x48);
  in_RDI->PyArray_DescrConverter_ = *(_func_int_PyObject_ptr_PyObject_ptr_ptr **)(lVar3 + 0x570);
  in_RDI->PyArray_EquivTypes_ = *(_func_bool_PyObject_ptr_PyObject_ptr **)(lVar3 + 0x5b0);
  in_RDI->PyArray_GetArrayParamsFromObject_ =
       *(_func_int_PyObject_ptr_PyObject_ptr_char_PyObject_ptr_ptr_int_ptr_Py_ssize_t_ptr_PyObject_ptr_ptr_PyObject_ptr
         **)(lVar3 + 0x8b0);
  in_RDI->PyArray_Squeeze_ = *(_func_PyObject_ptr_PyObject_ptr **)(lVar3 + 0x440);
  in_RDI->PyArray_SetBaseObject_ = *(_func_int_PyObject_ptr_PyObject_ptr **)(lVar3 + 0x8d0);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_30);
  module::~module((module *)&c.cache);
  return in_RDI;
}

Assistant:

static npy_api lookup() {
        module m = module::import("numpy.core.multiarray");
        auto c = m.attr("_ARRAY_API");
#if PY_MAJOR_VERSION >= 3
        void **api_ptr = (void **) PyCapsule_GetPointer(c.ptr(), NULL);
#else
        void **api_ptr = (void **) PyCObject_AsVoidPtr(c.ptr());
#endif
        npy_api api;
#define DECL_NPY_API(Func) api.Func##_ = (decltype(api.Func##_)) api_ptr[API_##Func];
        DECL_NPY_API(PyArray_GetNDArrayCFeatureVersion);
        if (api.PyArray_GetNDArrayCFeatureVersion_() < 0x7)
            pybind11_fail("pybind11 numpy support requires numpy >= 1.7.0");
        DECL_NPY_API(PyArray_Type);
        DECL_NPY_API(PyVoidArrType_Type);
        DECL_NPY_API(PyArrayDescr_Type);
        DECL_NPY_API(PyArray_DescrFromType);
        DECL_NPY_API(PyArray_DescrFromScalar);
        DECL_NPY_API(PyArray_FromAny);
        DECL_NPY_API(PyArray_Resize);
        DECL_NPY_API(PyArray_CopyInto);
        DECL_NPY_API(PyArray_NewCopy);
        DECL_NPY_API(PyArray_NewFromDescr);
        DECL_NPY_API(PyArray_DescrNewFromType);
        DECL_NPY_API(PyArray_DescrConverter);
        DECL_NPY_API(PyArray_EquivTypes);
        DECL_NPY_API(PyArray_GetArrayParamsFromObject);
        DECL_NPY_API(PyArray_Squeeze);
        DECL_NPY_API(PyArray_SetBaseObject);
#undef DECL_NPY_API
        return api;
    }